

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

void __thiscall lunasvg::SVGUseElement::SVGUseElement(SVGUseElement *this,Document *document)

{
  _Fwd_list_node_base *p_Var1;
  
  SVGGraphicsElement::SVGGraphicsElement(&this->super_SVGGraphicsElement,document,Use);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGUseElement_00158aa8;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGUseElement_00158aa8;
  SVGProperty::SVGProperty(&(this->m_x).super_SVGProperty,X);
  (this->m_x).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_x).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_x).super_SVGProperty.field_0xc = 0;
  (this->m_x).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_y).super_SVGProperty,Y);
  (this->m_y).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_y).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_y).super_SVGProperty.field_0xc = 0;
  (this->m_y).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_width).super_SVGProperty,Width);
  (this->m_width).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_width).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_width).super_SVGProperty.field_0xc = 0x42c80000;
  (this->m_width).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_height).super_SVGProperty,Height);
  (this->m_height).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_height).super_SVGProperty.field_0x9 = 0x101;
  *(undefined4 *)&(this->m_height).super_SVGProperty.field_0xc = 0x42c80000;
  (this->m_height).field_0x10 = 1;
  p_Var1 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var1->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var1[1]._M_next = (_Fwd_list_node_base *)&this->m_x;
  p_Var1->_M_next =
       (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var1;
  p_Var1 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var1->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var1[1]._M_next = (_Fwd_list_node_base *)&this->m_y;
  p_Var1->_M_next =
       (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var1;
  p_Var1 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var1->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var1[1]._M_next = (_Fwd_list_node_base *)&this->m_width;
  p_Var1->_M_next =
       (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var1;
  p_Var1 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var1->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var1[1]._M_next = (_Fwd_list_node_base *)&this->m_height;
  p_Var1->_M_next =
       (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGGraphicsElement).super_SVGElement.m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var1;
  return;
}

Assistant:

SVGUseElement::SVGUseElement(Document* document)
    : SVGGraphicsElement(document, ElementID::Use)
    , SVGURIReference(this)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_width(PropertyID::Width, LengthDirection::Horizontal, LengthNegativeMode::Forbid, 100.f, LengthUnits::Percent)
    , m_height(PropertyID::Height, LengthDirection::Vertical, LengthNegativeMode::Forbid, 100.f, LengthUnits::Percent)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_width);
    addProperty(m_height);
}